

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void init_lock(logging *log)

{
  pthread_mutex_init((pthread_mutex_t *)&log->lock,(pthread_mutexattr_t *)0x0);
  log->has_lock = true;
  return;
}

Assistant:

inline static void init_lock(struct logging *log) {
  #ifdef __linux
  pthread_mutex_init(&log->lock,NULL);
  #elif _WIN64
  log->lock = CreateMutex(NULL, FALSE, NULL);
  #endif
  log->has_lock =true;
}